

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O0

void __thiscall
GenerationIterator_InitialStoreIterationHasDistance1_Test::TestBody
          (GenerationIterator_InitialStoreIterationHasDistance1_Test *this)

{
  generation_iterator __last;
  generation_iterator __first;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e8;
  Message local_e0;
  typed_address<pstore::trailer> local_d8;
  typed_address<pstore::trailer> local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0 [3];
  database *local_98;
  database *pdStack_90;
  database *local_88;
  database *pdStack_80;
  difference_type local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  not_null<const_pstore::database_*> local_50;
  undefined1 auStack_48 [8];
  generation_iterator end;
  not_null<const_pstore::database_*> local_30;
  undefined1 auStack_28 [8];
  generation_iterator begin;
  database *d;
  GenerationIterator_InitialStoreIterationHasDistance1_Test *this_local;
  
  begin.pos_.a_.a_ =
       (address)anon_unknown.dwarf_e8c5d::GenerationIterator::db(&this->super_GenerationIterator);
  pstore::gsl::not_null<const_pstore::database_*>::not_null(&local_30,(database *)begin.pos_.a_.a_);
  end.pos_ = pstore::database::footer_pos((database *)begin.pos_.a_.a_);
  pstore::generation_iterator::generation_iterator
            ((generation_iterator *)auStack_28,local_30,end.pos_);
  pstore::gsl::not_null<const_pstore::database_*>::not_null(&local_50,(database *)begin.pos_.a_.a_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::typed_address<pstore::trailer>::null();
  pstore::generation_iterator::generation_iterator
            ((generation_iterator *)auStack_48,local_50,
             (typed_address<pstore::trailer>)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  local_6c = 1;
  local_88 = (database *)auStack_28;
  pdStack_80 = begin.db_;
  local_98 = (database *)auStack_48;
  pdStack_90 = end.db_;
  __first.pos_.a_.a_ = (address)(address)begin.db_;
  __first.db_ = (database *)auStack_28;
  __last.pos_.a_.a_ = (address)(address)end.db_;
  __last.db_ = (database *)auStack_48;
  local_78 = std::distance<pstore::generation_iterator>(__first,__last);
  testing::internal::EqHelper::Compare<unsigned_int,_long,_nullptr>
            ((EqHelper *)local_68,"1U","std::distance (begin, end)",&local_6c,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_d0 = pstore::typed_address<pstore::trailer>::make(0x40);
  local_d8 = pstore::generation_iterator::operator*((generation_iterator *)auStack_28);
  testing::internal::EqHelper::
  Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
            ((EqHelper *)local_c8,"trailer_address::make (pstore::leader_size)","*begin",&local_d0,
             &local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

TEST_F (GenerationIterator, InitialStoreIterationHasDistance1) {
    auto & d = this->db ();
    auto const begin = generation_iterator{&d, d.footer_pos ()};
    auto const end = generation_iterator{&d, trailer_address::null ()};
    EXPECT_EQ (1U, std::distance (begin, end));
    EXPECT_EQ (trailer_address::make (pstore::leader_size), *begin);
}